

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O3

int nghttp2_submit_priority
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,
              nghttp2_priority_spec *pri_spec)

{
  int iVar1;
  int iVar2;
  nghttp2_outbound_item *item;
  nghttp2_priority_spec copy_pri_spec;
  nghttp2_priority_spec local_30;
  
  iVar2 = 0;
  if ((((session->remote_settings).no_rfc7540_priorities != 1) &&
      (iVar2 = -0x1f5, pri_spec != (nghttp2_priority_spec *)0x0 && stream_id != 0)) &&
     (pri_spec->stream_id != stream_id)) {
    local_30.exclusive = pri_spec->exclusive;
    local_30._9_3_ = *(undefined3 *)&pri_spec->field_0x9;
    local_30.stream_id = pri_spec->stream_id;
    local_30.weight = pri_spec->weight;
    nghttp2_priority_spec_normalize_weight(&local_30);
    item = (nghttp2_outbound_item *)nghttp2_mem_malloc(&session->mem,0xa0);
    if (item == (nghttp2_outbound_item *)0x0) {
      iVar2 = -0x385;
    }
    else {
      nghttp2_outbound_item_init(item);
      nghttp2_frame_priority_init((nghttp2_priority *)item,stream_id,&local_30);
      iVar1 = nghttp2_session_add_item(session,item);
      iVar2 = 0;
      if (iVar1 != 0) {
        nghttp2_frame_priority_free((nghttp2_priority *)item);
        nghttp2_mem_free(&session->mem,item);
        iVar2 = iVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

int nghttp2_submit_priority(nghttp2_session *session, uint8_t flags,
                            int32_t stream_id,
                            const nghttp2_priority_spec *pri_spec) {
  int rv;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_priority_spec copy_pri_spec;
  nghttp2_mem *mem;
  (void)flags;

  mem = &session->mem;

  if (session->remote_settings.no_rfc7540_priorities == 1) {
    return 0;
  }

  if (stream_id == 0 || pri_spec == NULL) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (stream_id == pri_spec->stream_id) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  copy_pri_spec = *pri_spec;

  nghttp2_priority_spec_normalize_weight(&copy_pri_spec);

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));

  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;

  nghttp2_frame_priority_init(&frame->priority, stream_id, &copy_pri_spec);

  rv = nghttp2_session_add_item(session, item);

  if (rv != 0) {
    nghttp2_frame_priority_free(&frame->priority);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  return 0;
}